

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

void __thiscall Model::AddSpecies(Model *this,string *name,int copy_number)

{
  bool bVar1;
  invalid_argument *this_00;
  SpeciesTracker *this_01;
  SpeciesTracker *tracker;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  string *psStack_18;
  int copy_number_local;
  string *name_local;
  Model *this_local;
  
  local_1c = copy_number;
  psStack_18 = name;
  name_local = (string *)this;
  std::__cxx11::string::substr((ulong)&local_40,(ulong)name);
  bVar1 = std::operator==(&local_40,"__");
  std::__cxx11::string::~string((string *)&local_40);
  if (!bVar1) {
    this_01 = SpeciesTracker::Instance();
    SpeciesTracker::Increment(this_01,psStack_18,local_1c);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this_00,"Names prefixed with \'__\' (double underscore) are reserved for internal use."
            );
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void Model::AddSpecies(const std::string &name, int copy_number) {
  if (name.substr(0, 2) == "__") {
    throw std::invalid_argument(
        "Names prefixed with '__' (double underscore) are reserved for "
        "internal use.");
  }
  auto &tracker = SpeciesTracker::Instance();
  tracker.Increment(name, copy_number);
}